

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O3

TlvPtr __thiscall
ot::commissioner::tlv::Tlv::Deserialize
          (Tlv *this,Error *aError,size_t *aOffset,ByteArray *aBuf,Scope aScope)

{
  byte bVar1;
  char cVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ErrorCode EVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  pointer puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  ulong uVar9;
  type atVar10 [2];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar11;
  pointer puVar12;
  ulong uVar13;
  TlvPtr TVar14;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  writer write;
  Error error;
  writer local_f0;
  string local_e8;
  ErrorCode local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  ErrorCode local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  type local_78 [2];
  ulong *local_70;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_68;
  
  local_c8 = kNone;
  local_c0 = local_b0;
  local_b8 = 0;
  local_b0[0] = 0;
  uVar13 = *aOffset;
  this->mScope = kMeshCoP;
  this->mType = kChannel;
  *(undefined6 *)&this->field_0x2 = 0;
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uVar11 = uVar13 + 2;
  puVar7 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar7;
  local_70 = aOffset;
  if (uVar4 < uVar11) {
    local_68.types_ = (type  [2])((ulong)local_68.types_[1] << 0x20);
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of TLV";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x14;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar6 = "premature end of TLV";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_68);
      }
      pcVar6 = pcVar5;
    } while (pcVar5 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_e8,(v10 *)"premature end of TLV",(string_view)ZEXT816(0x14),args);
    local_a0 = kBadFormat;
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_e8._M_dataplus._M_p,
               local_e8._M_dataplus._M_p + local_e8._M_string_length);
    local_c8 = local_a0;
    std::__cxx11::string::operator=((string *)&local_c0,(string *)local_98);
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    uVar11 = uVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_001e954f;
  }
  else {
    bVar1 = puVar7[uVar13];
    atVar10._1_7_ = 0;
    atVar10[0]._0_1_ = bVar1;
    uVar9 = (ulong)puVar7[uVar13 + 1];
    if (uVar9 == 0xff) {
      if (uVar4 < uVar13 + 4) {
        local_68.types_[0] = uint_type;
        pcVar6 = "premature end of Extended TLV(type={})";
        local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "premature end of Extended TLV(type={})";
        local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x26;
        local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_68.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
        local_f0.handler_ = &local_68;
        local_68.context_.types_ = local_68.types_;
        do {
          cVar2 = *pcVar6;
          pcVar5 = pcVar6;
          while (cVar2 != '{') {
            pcVar5 = pcVar5 + 1;
            if (pcVar5 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
              ::writer::operator()((writer *)&local_f0,pcVar6,"");
              goto LAB_001e95d2;
            }
            cVar2 = *pcVar5;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
          ::writer::operator()((writer *)&local_f0,pcVar6,pcVar5);
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                             (pcVar5,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_68);
        } while (pcVar6 != "");
LAB_001e95d2:
        fmt_00.size_ = 2;
        fmt_00.data_ = (char *)0x26;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&local_68;
        local_68.types_ = atVar10;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_e8,(v10 *)"premature end of Extended TLV(type={})",fmt_00,args_01);
        local_a0 = kBadFormat;
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,local_e8._M_dataplus._M_p,
                   local_e8._M_dataplus._M_p + local_e8._M_string_length);
        local_c8 = local_a0;
        std::__cxx11::string::operator=((string *)&local_c0,(string *)local_98);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0]);
        }
        uVar13 = uVar11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        goto LAB_001e954f;
      }
      uVar9 = (ulong)(ushort)(*(ushort *)(puVar7 + uVar13 + 2) << 8 |
                             *(ushort *)(puVar7 + uVar13 + 2) >> 8);
      uVar11 = uVar13 + 4;
    }
    if (uVar11 + uVar9 <= uVar4) {
      puVar7 = (pointer)operator_new(0x30);
      puVar7[8] = '\x01';
      puVar7[9] = '\0';
      puVar7[10] = '\0';
      puVar7[0xb] = '\0';
      puVar7[0xc] = '\x01';
      puVar7[0xd] = '\0';
      puVar7[0xe] = '\0';
      puVar7[0xf] = '\0';
      *(undefined ***)puVar7 = &PTR___Sp_counted_ptr_inplace_002b4df8;
      puVar7[0x10] = aScope;
      puVar7[0x11] = bVar1;
      puVar7[0x18] = '\0';
      puVar7[0x19] = '\0';
      puVar7[0x1a] = '\0';
      puVar7[0x1b] = '\0';
      puVar7[0x1c] = '\0';
      puVar7[0x1d] = '\0';
      puVar7[0x1e] = '\0';
      puVar7[0x1f] = '\0';
      puVar7[0x20] = '\0';
      puVar7[0x21] = '\0';
      puVar7[0x22] = '\0';
      puVar7[0x23] = '\0';
      puVar7[0x24] = '\0';
      puVar7[0x25] = '\0';
      puVar7[0x26] = '\0';
      puVar7[0x27] = '\0';
      puVar7[0x28] = '\0';
      puVar7[0x29] = '\0';
      puVar7[0x2a] = '\0';
      puVar7[0x2b] = '\0';
      puVar7[0x2c] = '\0';
      puVar7[0x2d] = '\0';
      puVar7[0x2e] = '\0';
      puVar7[0x2f] = '\0';
      *(pointer *)this = puVar7 + 0x10;
      (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar7;
      puVar12 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + uVar11;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)(puVar7 + 0x18),puVar12,
                 puVar12 + uVar9);
      uVar13 = uVar11 + uVar9;
      goto LAB_001e954f;
    }
    local_68.types_[0] = uint_type;
    local_68.types_[1] = uint_type;
    pcVar6 = "premature end of TLV(type={}, length={})";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of TLV(type={}, length={})";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x28;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
    local_68.parse_funcs_[1] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
    local_f0.handler_ = &local_68;
    local_78 = atVar10;
    local_68.context_.types_ = local_68.types_;
    do {
      cVar2 = *pcVar6;
      pcVar5 = pcVar6;
      while (cVar2 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_unsigned_short>_>
          ::writer::operator()(&local_f0,pcVar6,"");
          goto LAB_001e94af;
        }
        cVar2 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_unsigned_short>_>
      ::writer::operator()(&local_f0,pcVar6,pcVar5);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char,unsigned_short>&>
                         (pcVar5,"",&local_68);
    } while (pcVar6 != "");
LAB_001e94af:
    local_68.types_[0] = local_78[0];
    local_68.types_[1] = local_78[1];
    fmt.size_ = 0x22;
    fmt.data_ = (char *)0x28;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = uVar9;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_e8,(v10 *)"premature end of TLV(type={}, length={})",fmt,args_00);
    local_a0 = kBadFormat;
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_e8._M_dataplus._M_p,
               local_e8._M_dataplus._M_p + local_e8._M_string_length);
    local_c8 = local_a0;
    std::__cxx11::string::operator=((string *)&local_c0,(string *)local_98);
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    uVar13 = uVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_001e954f;
  }
  operator_delete(local_e8._M_dataplus._M_p);
  uVar13 = uVar11;
LAB_001e954f:
  if (local_c8 == kNone) {
    *local_70 = uVar13;
    EVar3 = kNone;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
    this->mScope = kMeshCoP;
    this->mType = kChannel;
    *(undefined6 *)&this->field_0x2 = 0;
    (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    EVar3 = local_c8;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      EVar3 = local_c8;
    }
  }
  aError->mCode = EVar3;
  std::__cxx11::string::_M_assign((string *)&aError->mMessage);
  _Var8._M_pi = extraout_RDX;
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
    _Var8._M_pi = extraout_RDX_00;
  }
  TVar14.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  TVar14.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TlvPtr)TVar14.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TlvPtr Tlv::Deserialize(Error &aError, size_t &aOffset, const ByteArray &aBuf, Scope aScope)
{
    Error    error;
    size_t   offset = aOffset;
    uint8_t  type;
    uint16_t length;
    TlvPtr   tlv = nullptr;

    VerifyOrExit(offset + 2 <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of TLV"));
    type   = aBuf[offset++];
    length = aBuf[offset++];
    if (length == kEscapeLength)
    {
        VerifyOrExit(offset + 2 <= aBuf.size(),
                     error = ERROR_BAD_FORMAT("premature end of Extended TLV(type={})", type));

        length = (aBuf[offset++] << 8) & 0xFF00;
        length |= (aBuf[offset++]) & 0x00FF;
    }

    VerifyOrExit(offset + length <= aBuf.size(),
                 error = ERROR_BAD_FORMAT("premature end of TLV(type={}, length={})", type, length));

    tlv = std::make_shared<Tlv>(utils::from_underlying<Type>(type), aScope);
    tlv->SetValue(&aBuf[offset], length);

    offset += length;

exit:
    if (error != ErrorCode::kNone)
    {
        tlv = nullptr;
    }
    else
    {
        aOffset = offset;
    }

    aError = error;
    return tlv;
}